

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::astc_pack_bise(uint32_t *pDst,uint8_t *pSrc_vals,int bit_pos,int num_vals,int range)

{
  int iVar1;
  int in_ECX;
  undefined4 in_EDX;
  uint32_t *in_RSI;
  uint *in_RDI;
  int in_R8D;
  int *unaff_retaddr;
  uint8_t *in_stack_00000008;
  int i_1;
  int i;
  int limit;
  uint8_t vals [5];
  int group_index;
  int total_groups;
  int group_size;
  int num_bits;
  uint32_t temp [5];
  int local_60;
  int local_5c;
  int local_58;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffbc;
  int a;
  undefined4 uVar3;
  undefined4 uVar4;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  memset(&local_38,0,0x14);
  uVar4 = *(undefined4 *)(g_astc_bise_range_table + (long)in_R8D * 0xc);
  a = 0;
  if (*(int *)(g_astc_bise_range_table + (long)in_R8D * 0xc + 4) == 0) {
    if (*(int *)(g_astc_bise_range_table + (long)in_R8D * 0xc + 8) != 0) {
      a = 3;
    }
  }
  else {
    a = 5;
  }
  if (a == 0) {
    uVar3 = 0;
    for (local_5c = 0; local_5c < in_ECX; local_5c = local_5c + 1) {
      astc_set_bits_1_to_9
                ((uint32_t *)CONCAT44(uVar4,uVar3),
                 (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    }
  }
  else {
    if (a == 5) {
      local_60 = (in_ECX + 4) / 5;
    }
    else {
      local_60 = (in_ECX + 2) / 3;
    }
    for (iVar2 = 0; iVar2 < local_60; iVar2 = iVar2 + 1) {
      memset(&stack0xffffffffffffffb3,0,5);
      iVar1 = basisu::minimum<int>(a,in_ECX - iVar2 * a);
      for (local_58 = 0; local_58 < iVar1; local_58 = local_58 + 1) {
        (&stack0xffffffffffffffb3)[local_58] =
             *(undefined1 *)((long)in_RSI + (long)(iVar2 * a + local_58));
      }
      if (a == 5) {
        astc_encode_trits(_i,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
      }
      else {
        astc_encode_quints(in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX),
                           (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
      }
    }
  }
  *in_RDI = local_38 | *in_RDI;
  in_RDI[1] = local_34 | in_RDI[1];
  in_RDI[2] = local_30 | in_RDI[2];
  in_RDI[3] = local_2c | in_RDI[3];
  return;
}

Assistant:

static void astc_pack_bise(uint32_t* pDst, const uint8_t* pSrc_vals, int bit_pos, int num_vals, int range)
	{
		uint32_t temp[5] = { 0, 0, 0, 0, 0 };

		const int num_bits = g_astc_bise_range_table[range][0];

		int group_size = 0;
		if (g_astc_bise_range_table[range][1])
			group_size = 5;
		else if (g_astc_bise_range_table[range][2])
			group_size = 3;

		if (group_size)
		{
			// Range has trits or quints - pack each group of 5 or 3 values 
			const int total_groups = (group_size == 5) ? ((num_vals + 4) / 5) : ((num_vals + 2) / 3);

			for (int group_index = 0; group_index < total_groups; group_index++)
			{
				uint8_t vals[5] = { 0, 0, 0, 0, 0 };

				const int limit = basisu::minimum(group_size, num_vals - group_index * group_size);
				for (int i = 0; i < limit; i++)
					vals[i] = pSrc_vals[group_index * group_size + i];

				if (group_size == 5)
					astc_encode_trits(temp, vals, bit_pos, num_bits);
				else
					astc_encode_quints(temp, vals, bit_pos, num_bits);
			}
		}
		else
		{
			for (int i = 0; i < num_vals; i++)
				astc_set_bits_1_to_9(temp, bit_pos, pSrc_vals[i], num_bits);
		}

		pDst[0] |= temp[0]; pDst[1] |= temp[1];
		pDst[2] |= temp[2]; pDst[3] |= temp[3];
	}